

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O0

void ncnn::transpose_pack_B_tile(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined8 uVar29;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int kk_14;
  float *p0_14;
  int kk_13;
  float *p0_13;
  int kk_12;
  float *p0_12;
  int kk_11;
  float *p0_11;
  __m128 _tmp1_4;
  __m128 _tmp0_4;
  __m128 _r1_7;
  __m128 _r0_7;
  int kk_10;
  float *p0_10;
  __m256 _r1_6;
  __m256 _r0_6;
  int kk_9;
  float *p0_9;
  int kk_8;
  float *p0_8;
  __m128 tmp0_5;
  __m128 tmp1_5;
  __m128 tmp2_5;
  __m128 tmp3_5;
  __m128 _r3_5;
  __m128 _r2_5;
  __m128 _r1_5;
  __m128 _r0_5;
  int kk_7;
  float *p0_7;
  __m256 _r3_4;
  __m256 _r2_4;
  __m256 _r1_4;
  __m256 _r0_4;
  int kk_6;
  float *p0_6;
  int kk_5;
  float *p0_5;
  __m128 tmp0_4;
  __m128 tmp1_4;
  __m128 tmp2_4;
  __m128 tmp3_4;
  __m128 tmp0_3;
  __m128 tmp1_3;
  __m128 tmp2_3;
  __m128 tmp3_3;
  __m128 _r7_3;
  __m128 _r6_3;
  __m128 _r5_3;
  __m128 _r4_3;
  __m128 _r3_3;
  __m128 _r2_3;
  __m128 _r1_3;
  __m128 _r0_3;
  int kk_4;
  float *p0_4;
  __m256 _r7_2;
  __m256 _r6_2;
  __m256 _r5_2;
  __m256 _r4_2;
  __m256 _r3_2;
  __m256 _r2_2;
  __m256 _r1_2;
  __m256 _r0_2;
  int kk_3;
  float *p0_3;
  int kk_2;
  float *p0_2;
  __m128 tmp0_2;
  __m128 tmp1_2;
  __m128 tmp2_2;
  __m128 tmp3_2;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _rb_1;
  __m128 _ra_1;
  __m128 _r9_1;
  __m128 _r8_1;
  __m128 _r7_1;
  __m128 _r6_1;
  __m128 _r5_1;
  __m128 _r4_1;
  __m128 _r3_1;
  __m128 _r2_1;
  __m128 _r1_1;
  __m128 _r0_1;
  int kk_1;
  float *p0_1;
  __m256 _rb;
  __m256 _ra;
  __m256 _r9;
  __m256 _r8;
  __m256 _r7;
  __m256 _r6;
  __m256 _r5;
  __m256 _r4;
  __m256 _r3;
  __m256 _r2;
  __m256 _r1;
  __m256 _r0;
  int kk;
  float *p0;
  int jj;
  float *pp;
  int B_hstep;
  int elempack;
  __m256 _tmpf_1;
  __m256 _tmpe_1;
  __m256 _tmpd_1;
  __m256 _tmpc_1;
  __m256 _tmpb_1;
  __m256 _tmpa_1;
  __m256 _tmp9_1;
  __m256 _tmp8_1;
  __m256 _tmp7_1;
  __m256 _tmp6_1;
  __m256 _tmp5_1;
  __m256 _tmp4_1;
  __m256 _tmp3_1;
  __m256 _tmp2_1;
  __m256 _tmp1_1;
  __m256 _tmp0_1;
  __m256 _tmp7_2;
  __m256 _tmp6_2;
  __m256 _tmp5_2;
  __m256 _tmp4_2;
  __m256 _tmp3_2;
  __m256 _tmp2_2;
  __m256 _tmp1_2;
  __m256 _tmp0_2;
  __m256 _tmp1_3;
  __m256 _tmp0_3;
  __m256 _tmpn;
  __m256 _tmpm;
  __m256 _tmpl;
  __m256 _tmpk;
  __m256 _tmpj;
  __m256 _tmpi;
  __m256 _tmph;
  __m256 _tmpg;
  __m256 _tmpf;
  __m256 _tmpe;
  __m256 _tmpd;
  __m256 _tmpc;
  __m256 _tmpb;
  __m256 _tmpa;
  __m256 _tmp9;
  __m256 _tmp8;
  __m256 _tmp7;
  __m256 _tmp6;
  __m256 _tmp5;
  __m256 _tmp4;
  __m256 _tmp3;
  __m256 _tmp2;
  __m256 _tmp1;
  __m256 _tmp0;
  int local_2930;
  int local_292c;
  undefined4 *local_2928;
  int local_291c;
  undefined1 (*local_2918) [16];
  int local_290c;
  undefined1 (*local_2908) [32];
  int local_28fc;
  undefined4 *local_28f8;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  int local_28ac;
  undefined1 (*local_28a8) [16];
  int local_284c;
  undefined1 (*local_2848) [32];
  int local_283c;
  undefined1 (*local_2838) [16];
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 local_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  int local_27ac;
  undefined1 (*local_27a8) [16];
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  int local_270c;
  undefined1 (*local_2708) [32];
  int local_26fc;
  undefined8 *local_26f8;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 local_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 local_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 local_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  int local_25ec;
  undefined1 (*local_25e8) [16];
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  int local_24cc;
  undefined1 (*local_24c8) [32];
  int local_24bc;
  undefined8 *local_24b8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 local_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 local_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 local_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 local_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 local_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  int local_232c;
  undefined1 (*local_2328) [16];
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  int local_219c;
  undefined1 (*local_2198) [32];
  int local_218c;
  undefined1 (*local_2188) [32];
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_540;
  undefined8 uStack_538;
  
  iVar1 = (int)in_RDI[3];
  if ((int)in_RDI[5] == 3) {
    local_2930 = (int)in_RDI[8];
  }
  else {
    local_2930 = *(int *)((long)in_RDI + 0x2c);
  }
  local_2188 = (undefined1 (*) [32])*in_RSI;
  for (local_218c = 0; local_218c + 0xb < in_ECX; local_218c = local_218c + 0xc) {
    if (iVar1 == 8) {
      local_2198 = (undefined1 (*) [32])
                   (*in_RDI + (long)(in_R8D * local_2930) * 4 +
                   (long)((in_EDX + local_218c) * 8) * 4);
      for (local_219c = 0; local_219c + 7 < in_R9D; local_219c = local_219c + 8) {
        auVar23 = vunpcklps_avx(*local_2198,local_2198[1]);
        auVar6 = vunpckhps_avx(*local_2198,local_2198[1]);
        auVar24 = vunpcklps_avx(local_2198[2],local_2198[3]);
        auVar7 = vunpckhps_avx(local_2198[2],local_2198[3]);
        auVar25 = vunpcklps_avx(local_2198[4],local_2198[5]);
        auVar8 = vunpckhps_avx(local_2198[4],local_2198[5]);
        auVar26 = vunpcklps_avx(local_2198[6],local_2198[7]);
        auVar9 = vunpckhps_avx(local_2198[6],local_2198[7]);
        auVar27 = vunpcklps_avx(local_2198[8],local_2198[9]);
        auVar10 = vunpckhps_avx(local_2198[8],local_2198[9]);
        auVar28 = vunpcklps_avx(local_2198[10],local_2198[0xb]);
        auVar11 = vunpckhps_avx(local_2198[10],local_2198[0xb]);
        auVar17 = vunpcklpd_avx(auVar23,auVar24);
        auVar23 = vunpckhpd_avx(auVar23,auVar24);
        auVar24 = vunpcklpd_avx(auVar6,auVar7);
        auVar6 = vunpckhpd_avx(auVar6,auVar7);
        auVar18 = vunpcklpd_avx(auVar25,auVar26);
        auVar7 = vunpckhpd_avx(auVar25,auVar26);
        auVar25 = vunpcklpd_avx(auVar8,auVar9);
        auVar8 = vunpckhpd_avx(auVar8,auVar9);
        auVar26 = vunpcklpd_avx(auVar27,auVar28);
        auVar9 = vunpckhpd_avx(auVar27,auVar28);
        auVar27 = vunpcklpd_avx(auVar10,auVar11);
        auVar10 = vunpckhpd_avx(auVar10,auVar11);
        local_540 = auVar17._0_8_;
        uStack_538 = auVar17._8_8_;
        local_5c0 = auVar18._0_8_;
        uStack_5b8 = auVar18._8_8_;
        local_640 = auVar26._0_8_;
        uStack_638 = auVar26._8_8_;
        local_560 = auVar23._0_8_;
        uStack_558 = auVar23._8_8_;
        local_5e0 = auVar7._0_8_;
        uStack_5d8 = auVar7._8_8_;
        local_660 = auVar9._0_8_;
        uStack_658 = auVar9._8_8_;
        local_580 = auVar24._0_8_;
        uStack_578 = auVar24._8_8_;
        local_600 = auVar25._0_8_;
        uStack_5f8 = auVar25._8_8_;
        local_680 = auVar27._0_8_;
        uStack_678 = auVar27._8_8_;
        local_5a0 = auVar6._0_8_;
        uStack_598 = auVar6._8_8_;
        local_620 = auVar8._0_8_;
        uStack_618 = auVar8._8_8_;
        local_6a0 = auVar10._0_8_;
        uStack_698 = auVar10._8_8_;
        auVar11 = vperm2f128_avx(auVar17,auVar18,0x31);
        uStack_2268 = auVar11._24_8_;
        uStack_2270 = auVar11._16_8_;
        uStack_2278 = auVar11._8_8_;
        local_2280 = auVar11._0_8_;
        auVar23 = vperm2f128_avx(auVar26,auVar23,0x31);
        uStack_2288 = auVar23._24_8_;
        uStack_2290 = auVar23._16_8_;
        uStack_2298 = auVar23._8_8_;
        local_22a0 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar7,auVar9,0x31);
        uStack_22a8 = auVar23._24_8_;
        uStack_22b0 = auVar23._16_8_;
        uStack_22b8 = auVar23._8_8_;
        local_22c0 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar24,auVar25,0x31);
        uStack_22c8 = auVar23._24_8_;
        uStack_22d0 = auVar23._16_8_;
        uStack_22d8 = auVar23._8_8_;
        local_22e0 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar27,auVar6,0x31);
        uStack_22e8 = auVar23._24_8_;
        uStack_22f0 = auVar23._16_8_;
        uStack_22f8 = auVar23._8_8_;
        local_2300 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar8,auVar10,0x31);
        *(undefined8 *)*local_2188 = local_540;
        *(undefined8 *)(*local_2188 + 8) = uStack_538;
        *(undefined8 *)(*local_2188 + 0x10) = local_5c0;
        *(undefined8 *)(*local_2188 + 0x18) = uStack_5b8;
        *(undefined8 *)local_2188[1] = local_640;
        *(undefined8 *)(local_2188[1] + 8) = uStack_638;
        *(undefined8 *)(local_2188[1] + 0x10) = local_560;
        *(undefined8 *)(local_2188[1] + 0x18) = uStack_558;
        *(undefined8 *)local_2188[2] = local_5e0;
        *(undefined8 *)(local_2188[2] + 8) = uStack_5d8;
        *(undefined8 *)(local_2188[2] + 0x10) = local_660;
        *(undefined8 *)(local_2188[2] + 0x18) = uStack_658;
        *(undefined8 *)local_2188[3] = local_580;
        *(undefined8 *)(local_2188[3] + 8) = uStack_578;
        *(undefined8 *)(local_2188[3] + 0x10) = local_600;
        *(undefined8 *)(local_2188[3] + 0x18) = uStack_5f8;
        *(undefined8 *)local_2188[4] = local_680;
        *(undefined8 *)(local_2188[4] + 8) = uStack_678;
        *(undefined8 *)(local_2188[4] + 0x10) = local_5a0;
        *(undefined8 *)(local_2188[4] + 0x18) = uStack_598;
        *(undefined8 *)local_2188[5] = local_620;
        *(undefined8 *)(local_2188[5] + 8) = uStack_618;
        *(undefined8 *)(local_2188[5] + 0x10) = local_6a0;
        *(undefined8 *)(local_2188[5] + 0x18) = uStack_698;
        *(undefined8 *)local_2188[6] = local_2280;
        *(undefined8 *)(local_2188[6] + 8) = uStack_2278;
        *(undefined8 *)(local_2188[6] + 0x10) = uStack_2270;
        *(undefined8 *)(local_2188[6] + 0x18) = uStack_2268;
        *(undefined8 *)local_2188[7] = local_22a0;
        *(undefined8 *)(local_2188[7] + 8) = uStack_2298;
        *(undefined8 *)(local_2188[7] + 0x10) = uStack_2290;
        *(undefined8 *)(local_2188[7] + 0x18) = uStack_2288;
        *(undefined8 *)local_2188[8] = local_22c0;
        *(undefined8 *)(local_2188[8] + 8) = uStack_22b8;
        *(undefined8 *)(local_2188[8] + 0x10) = uStack_22b0;
        *(undefined8 *)(local_2188[8] + 0x18) = uStack_22a8;
        *(undefined8 *)local_2188[9] = local_22e0;
        *(undefined8 *)(local_2188[9] + 8) = uStack_22d8;
        *(undefined8 *)(local_2188[9] + 0x10) = uStack_22d0;
        *(undefined8 *)(local_2188[9] + 0x18) = uStack_22c8;
        *(undefined8 *)local_2188[10] = local_2300;
        *(undefined8 *)(local_2188[10] + 8) = uStack_22f8;
        *(undefined8 *)(local_2188[10] + 0x10) = uStack_22f0;
        *(undefined8 *)(local_2188[10] + 0x18) = uStack_22e8;
        local_2188[0xb] = auVar23;
        local_2188 = local_2188 + 0xc;
        local_2198 = (undefined1 (*) [32])(*local_2198 + (long)(local_2930 << 3) * 4);
      }
    }
    if (iVar1 == 4) {
      local_2328 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_2930) * 4 +
                   (long)((in_EDX + local_218c) * 4) * 4);
      for (local_232c = 0; local_232c + 3 < in_R9D; local_232c = local_232c + 4) {
        auVar19 = vunpcklps_avx(*local_2328,local_2328[1]);
        auVar20 = vunpcklps_avx(local_2328[2],local_2328[3]);
        auVar2 = vunpckhps_avx(*local_2328,local_2328[1]);
        auVar3 = vunpckhps_avx(local_2328[2],local_2328[3]);
        auVar12 = vunpcklpd_avx(auVar19,auVar20);
        auVar19 = vunpckhpd_avx(auVar19,auVar20);
        auVar13 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        auVar3 = vunpcklps_avx(local_2328[4],local_2328[5]);
        auVar21 = vunpcklps_avx(local_2328[6],local_2328[7]);
        auVar20 = vunpckhps_avx(local_2328[4],local_2328[5]);
        auVar4 = vunpckhps_avx(local_2328[6],local_2328[7]);
        auVar14 = vunpcklpd_avx(auVar3,auVar21);
        auVar3 = vunpckhpd_avx(auVar3,auVar21);
        auVar15 = vunpcklpd_avx(auVar20,auVar4);
        auVar20 = vunpckhpd_avx(auVar20,auVar4);
        auVar4 = vunpcklps_avx(local_2328[8],local_2328[9]);
        auVar22 = vunpcklps_avx(local_2328[10],local_2328[0xb]);
        auVar21 = vunpckhps_avx(local_2328[8],local_2328[9]);
        auVar5 = vunpckhps_avx(local_2328[10],local_2328[0xb]);
        auVar16 = vunpcklpd_avx(auVar4,auVar22);
        auVar4 = vunpckhpd_avx(auVar4,auVar22);
        auVar22 = vunpcklpd_avx(auVar21,auVar5);
        auVar21 = vunpckhpd_avx(auVar21,auVar5);
        local_2340 = auVar12._0_8_;
        uStack_2338 = auVar12._8_8_;
        *(undefined8 *)*local_2188 = local_2340;
        *(undefined8 *)(*local_2188 + 8) = uStack_2338;
        local_2380 = auVar14._0_8_;
        uStack_2378 = auVar14._8_8_;
        *(undefined8 *)(*local_2188 + 0x10) = local_2380;
        *(undefined8 *)(*local_2188 + 0x18) = uStack_2378;
        local_23c0 = auVar16._0_8_;
        uStack_23b8 = auVar16._8_8_;
        *(undefined8 *)local_2188[1] = local_23c0;
        *(undefined8 *)(local_2188[1] + 8) = uStack_23b8;
        local_2350 = auVar19._0_8_;
        uStack_2348 = auVar19._8_8_;
        *(undefined8 *)(local_2188[1] + 0x10) = local_2350;
        *(undefined8 *)(local_2188[1] + 0x18) = uStack_2348;
        local_2390 = auVar3._0_8_;
        uStack_2388 = auVar3._8_8_;
        *(undefined8 *)local_2188[2] = local_2390;
        *(undefined8 *)(local_2188[2] + 8) = uStack_2388;
        local_23d0 = auVar4._0_8_;
        uStack_23c8 = auVar4._8_8_;
        *(undefined8 *)(local_2188[2] + 0x10) = local_23d0;
        *(undefined8 *)(local_2188[2] + 0x18) = uStack_23c8;
        local_2360 = auVar13._0_8_;
        uStack_2358 = auVar13._8_8_;
        *(undefined8 *)local_2188[3] = local_2360;
        *(undefined8 *)(local_2188[3] + 8) = uStack_2358;
        local_23a0 = auVar15._0_8_;
        uStack_2398 = auVar15._8_8_;
        *(undefined8 *)(local_2188[3] + 0x10) = local_23a0;
        *(undefined8 *)(local_2188[3] + 0x18) = uStack_2398;
        local_23e0 = auVar22._0_8_;
        uStack_23d8 = auVar22._8_8_;
        *(undefined8 *)local_2188[4] = local_23e0;
        *(undefined8 *)(local_2188[4] + 8) = uStack_23d8;
        local_2370 = auVar2._0_8_;
        uStack_2368 = auVar2._8_8_;
        *(undefined8 *)(local_2188[4] + 0x10) = local_2370;
        *(undefined8 *)(local_2188[4] + 0x18) = uStack_2368;
        local_23b0 = auVar20._0_8_;
        uStack_23a8 = auVar20._8_8_;
        *(undefined8 *)local_2188[5] = local_23b0;
        *(undefined8 *)(local_2188[5] + 8) = uStack_23a8;
        *(undefined1 (*) [16])(local_2188[5] + 0x10) = auVar21;
        local_2188 = local_2188 + 6;
        local_2328 = (undefined1 (*) [16])(*local_2328 + (long)(local_2930 << 2) * 4);
      }
    }
    if (iVar1 == 1) {
      local_24b8 = (undefined8 *)
                   (*in_RDI + (long)(in_R8D * local_2930) * 4 + (long)(in_EDX + local_218c) * 4);
      for (local_24bc = 0; local_24bc < in_R9D; local_24bc = local_24bc + 1) {
        uVar29 = local_24b8[1];
        *(undefined8 *)*local_2188 = *local_24b8;
        *(undefined8 *)(*local_2188 + 8) = uVar29;
        uVar29 = local_24b8[3];
        *(undefined8 *)(*local_2188 + 0x10) = local_24b8[2];
        *(undefined8 *)(*local_2188 + 0x18) = uVar29;
        *(undefined1 (*) [16])local_2188[1] = *(undefined1 (*) [16])(local_24b8 + 4);
        local_2188 = (undefined1 (*) [32])(local_2188[1] + 0x10);
        local_24b8 = (undefined8 *)((long)local_24b8 + (long)local_2930 * 4);
      }
    }
  }
  for (; local_218c + 7 < in_ECX; local_218c = local_218c + 8) {
    if (iVar1 == 8) {
      local_24c8 = (undefined1 (*) [32])
                   (*in_RDI + (long)(in_R8D * local_2930) * 4 +
                   (long)((in_EDX + local_218c) * 8) * 4);
      for (local_24cc = 0; local_24cc + 7 < in_R9D; local_24cc = local_24cc + 8) {
        auVar23 = vunpcklps_avx(*local_24c8,local_24c8[1]);
        auVar6 = vunpckhps_avx(*local_24c8,local_24c8[1]);
        auVar11 = vunpcklps_avx(local_24c8[2],local_24c8[3]);
        auVar7 = vunpckhps_avx(local_24c8[2],local_24c8[3]);
        auVar24 = vunpcklps_avx(local_24c8[4],local_24c8[5]);
        auVar8 = vunpckhps_avx(local_24c8[4],local_24c8[5]);
        auVar18 = vunpcklps_avx(local_24c8[6],local_24c8[7]);
        auVar9 = vunpckhps_avx(local_24c8[6],local_24c8[7]);
        auVar10 = vunpcklpd_avx(auVar23,auVar11);
        auVar23 = vunpckhpd_avx(auVar23,auVar11);
        auVar11 = vunpcklpd_avx(auVar6,auVar7);
        auVar6 = vunpckhpd_avx(auVar6,auVar7);
        auVar17 = vunpcklpd_avx(auVar24,auVar18);
        auVar7 = vunpckhpd_avx(auVar24,auVar18);
        auVar24 = vunpcklpd_avx(auVar8,auVar9);
        auVar8 = vunpckhpd_avx(auVar8,auVar9);
        local_1f20 = auVar10._0_8_;
        uStack_1f18 = auVar10._8_8_;
        local_1fa0 = auVar17._0_8_;
        uStack_1f98 = auVar17._8_8_;
        local_1f40 = auVar23._0_8_;
        uStack_1f38 = auVar23._8_8_;
        local_1fc0 = auVar7._0_8_;
        uStack_1fb8 = auVar7._8_8_;
        local_1f60 = auVar11._0_8_;
        uStack_1f58 = auVar11._8_8_;
        local_1fe0 = auVar24._0_8_;
        uStack_1fd8 = auVar24._8_8_;
        local_1f80 = auVar6._0_8_;
        uStack_1f78 = auVar6._8_8_;
        local_2000 = auVar8._0_8_;
        uStack_1ff8 = auVar8._8_8_;
        auVar9 = vperm2f128_avx(auVar10,auVar17,0x31);
        uStack_2568 = auVar9._24_8_;
        uStack_2570 = auVar9._16_8_;
        uStack_2578 = auVar9._8_8_;
        local_2580 = auVar9._0_8_;
        auVar23 = vperm2f128_avx(auVar23,auVar7,0x31);
        uStack_2588 = auVar23._24_8_;
        uStack_2590 = auVar23._16_8_;
        uStack_2598 = auVar23._8_8_;
        local_25a0 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar11,auVar24,0x31);
        uStack_25a8 = auVar23._24_8_;
        uStack_25b0 = auVar23._16_8_;
        uStack_25b8 = auVar23._8_8_;
        local_25c0 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar6,auVar8,0x31);
        *(undefined8 *)*local_2188 = local_1f20;
        *(undefined8 *)(*local_2188 + 8) = uStack_1f18;
        *(undefined8 *)(*local_2188 + 0x10) = local_1fa0;
        *(undefined8 *)(*local_2188 + 0x18) = uStack_1f98;
        *(undefined8 *)local_2188[1] = local_1f40;
        *(undefined8 *)(local_2188[1] + 8) = uStack_1f38;
        *(undefined8 *)(local_2188[1] + 0x10) = local_1fc0;
        *(undefined8 *)(local_2188[1] + 0x18) = uStack_1fb8;
        *(undefined8 *)local_2188[2] = local_1f60;
        *(undefined8 *)(local_2188[2] + 8) = uStack_1f58;
        *(undefined8 *)(local_2188[2] + 0x10) = local_1fe0;
        *(undefined8 *)(local_2188[2] + 0x18) = uStack_1fd8;
        *(undefined8 *)local_2188[3] = local_1f80;
        *(undefined8 *)(local_2188[3] + 8) = uStack_1f78;
        *(undefined8 *)(local_2188[3] + 0x10) = local_2000;
        *(undefined8 *)(local_2188[3] + 0x18) = uStack_1ff8;
        *(undefined8 *)local_2188[4] = local_2580;
        *(undefined8 *)(local_2188[4] + 8) = uStack_2578;
        *(undefined8 *)(local_2188[4] + 0x10) = uStack_2570;
        *(undefined8 *)(local_2188[4] + 0x18) = uStack_2568;
        *(undefined8 *)local_2188[5] = local_25a0;
        *(undefined8 *)(local_2188[5] + 8) = uStack_2598;
        *(undefined8 *)(local_2188[5] + 0x10) = uStack_2590;
        *(undefined8 *)(local_2188[5] + 0x18) = uStack_2588;
        *(undefined8 *)local_2188[6] = local_25c0;
        *(undefined8 *)(local_2188[6] + 8) = uStack_25b8;
        *(undefined8 *)(local_2188[6] + 0x10) = uStack_25b0;
        *(undefined8 *)(local_2188[6] + 0x18) = uStack_25a8;
        local_2188[7] = auVar23;
        local_2188 = local_2188 + 8;
        local_24c8 = (undefined1 (*) [32])(*local_24c8 + (long)(local_2930 << 3) * 4);
      }
    }
    if (iVar1 == 4) {
      local_25e8 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_2930) * 4 +
                   (long)((in_EDX + local_218c) * 4) * 4);
      for (local_25ec = 0; local_25ec + 3 < in_R9D; local_25ec = local_25ec + 4) {
        auVar19 = vunpcklps_avx(*local_25e8,local_25e8[1]);
        auVar20 = vunpcklps_avx(local_25e8[2],local_25e8[3]);
        auVar2 = vunpckhps_avx(*local_25e8,local_25e8[1]);
        auVar3 = vunpckhps_avx(local_25e8[2],local_25e8[3]);
        auVar21 = vunpcklpd_avx(auVar19,auVar20);
        auVar19 = vunpckhpd_avx(auVar19,auVar20);
        auVar5 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        auVar3 = vunpcklps_avx(local_25e8[4],local_25e8[5]);
        auVar13 = vunpcklps_avx(local_25e8[6],local_25e8[7]);
        auVar20 = vunpckhps_avx(local_25e8[4],local_25e8[5]);
        auVar4 = vunpckhps_avx(local_25e8[6],local_25e8[7]);
        auVar12 = vunpcklpd_avx(auVar3,auVar13);
        auVar3 = vunpckhpd_avx(auVar3,auVar13);
        auVar13 = vunpcklpd_avx(auVar20,auVar4);
        auVar20 = vunpckhpd_avx(auVar20,auVar4);
        local_2600 = auVar21._0_8_;
        uStack_25f8 = auVar21._8_8_;
        *(undefined8 *)*local_2188 = local_2600;
        *(undefined8 *)(*local_2188 + 8) = uStack_25f8;
        local_2640 = auVar12._0_8_;
        uStack_2638 = auVar12._8_8_;
        *(undefined8 *)(*local_2188 + 0x10) = local_2640;
        *(undefined8 *)(*local_2188 + 0x18) = uStack_2638;
        local_2610 = auVar19._0_8_;
        uStack_2608 = auVar19._8_8_;
        *(undefined8 *)local_2188[1] = local_2610;
        *(undefined8 *)(local_2188[1] + 8) = uStack_2608;
        local_2650 = auVar3._0_8_;
        uStack_2648 = auVar3._8_8_;
        *(undefined8 *)(local_2188[1] + 0x10) = local_2650;
        *(undefined8 *)(local_2188[1] + 0x18) = uStack_2648;
        local_2620 = auVar5._0_8_;
        uStack_2618 = auVar5._8_8_;
        *(undefined8 *)local_2188[2] = local_2620;
        *(undefined8 *)(local_2188[2] + 8) = uStack_2618;
        local_2660 = auVar13._0_8_;
        uStack_2658 = auVar13._8_8_;
        *(undefined8 *)(local_2188[2] + 0x10) = local_2660;
        *(undefined8 *)(local_2188[2] + 0x18) = uStack_2658;
        local_2630 = auVar2._0_8_;
        uStack_2628 = auVar2._8_8_;
        *(undefined8 *)local_2188[3] = local_2630;
        *(undefined8 *)(local_2188[3] + 8) = uStack_2628;
        *(undefined1 (*) [16])(local_2188[3] + 0x10) = auVar20;
        local_2188 = local_2188 + 4;
        local_25e8 = (undefined1 (*) [16])(*local_25e8 + (long)(local_2930 << 2) * 4);
      }
    }
    if (iVar1 == 1) {
      local_26f8 = (undefined8 *)
                   (*in_RDI + (long)(in_R8D * local_2930) * 4 + (long)(in_EDX + local_218c) * 4);
      for (local_26fc = 0; local_26fc < in_R9D; local_26fc = local_26fc + 1) {
        uVar29 = local_26f8[1];
        *(undefined8 *)*local_2188 = *local_26f8;
        *(undefined8 *)(*local_2188 + 8) = uVar29;
        *(undefined1 (*) [16])(*local_2188 + 0x10) = *(undefined1 (*) [16])(local_26f8 + 2);
        local_2188 = local_2188 + 1;
        local_26f8 = (undefined8 *)((long)local_26f8 + (long)local_2930 * 4);
      }
    }
  }
  for (; local_218c + 3 < in_ECX; local_218c = local_218c + 4) {
    if (iVar1 == 8) {
      local_2708 = (undefined1 (*) [32])
                   (*in_RDI + (long)(in_R8D * local_2930) * 4 +
                   (long)((in_EDX + local_218c) * 8) * 4);
      for (local_270c = 0; local_270c + 7 < in_R9D; local_270c = local_270c + 8) {
        auVar23 = vunpcklps_avx(*local_2708,local_2708[1]);
        auVar6 = vunpckhps_avx(*local_2708,local_2708[1]);
        auVar9 = vunpcklps_avx(local_2708[2],local_2708[3]);
        auVar7 = vunpckhps_avx(local_2708[2],local_2708[3]);
        auVar8 = vunpcklpd_avx(auVar23,auVar9);
        auVar23 = vunpckhpd_avx(auVar23,auVar9);
        auVar9 = vunpcklpd_avx(auVar6,auVar7);
        auVar6 = vunpckhpd_avx(auVar6,auVar7);
        local_b80 = auVar8._0_8_;
        uStack_b78 = auVar8._8_8_;
        local_ba0 = auVar23._0_8_;
        uStack_b98 = auVar23._8_8_;
        local_bc0 = auVar9._0_8_;
        uStack_bb8 = auVar9._8_8_;
        local_be0 = auVar6._0_8_;
        uStack_bd8 = auVar6._8_8_;
        auVar23 = vperm2f128_avx(auVar8,auVar23,0x31);
        uStack_2768 = auVar23._24_8_;
        uStack_2770 = auVar23._16_8_;
        uStack_2778 = auVar23._8_8_;
        local_2780 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar9,auVar6,0x31);
        *(undefined8 *)*local_2188 = local_b80;
        *(undefined8 *)(*local_2188 + 8) = uStack_b78;
        *(undefined8 *)(*local_2188 + 0x10) = local_ba0;
        *(undefined8 *)(*local_2188 + 0x18) = uStack_b98;
        *(undefined8 *)local_2188[1] = local_bc0;
        *(undefined8 *)(local_2188[1] + 8) = uStack_bb8;
        *(undefined8 *)(local_2188[1] + 0x10) = local_be0;
        *(undefined8 *)(local_2188[1] + 0x18) = uStack_bd8;
        *(undefined8 *)local_2188[2] = local_2780;
        *(undefined8 *)(local_2188[2] + 8) = uStack_2778;
        *(undefined8 *)(local_2188[2] + 0x10) = uStack_2770;
        *(undefined8 *)(local_2188[2] + 0x18) = uStack_2768;
        local_2188[3] = auVar23;
        local_2188 = local_2188 + 4;
        local_2708 = (undefined1 (*) [32])(*local_2708 + (long)(local_2930 << 3) * 4);
      }
    }
    if (iVar1 == 4) {
      local_27a8 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_2930) * 4 +
                   (long)((in_EDX + local_218c) * 4) * 4);
      for (local_27ac = 0; local_27ac + 3 < in_R9D; local_27ac = local_27ac + 4) {
        auVar19 = vunpcklps_avx(*local_27a8,local_27a8[1]);
        auVar4 = vunpcklps_avx(local_27a8[2],local_27a8[3]);
        auVar2 = vunpckhps_avx(*local_27a8,local_27a8[1]);
        auVar3 = vunpckhps_avx(local_27a8[2],local_27a8[3]);
        auVar20 = vunpcklpd_avx(auVar19,auVar4);
        auVar19 = vunpckhpd_avx(auVar19,auVar4);
        auVar4 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        local_27c0 = auVar20._0_8_;
        uStack_27b8 = auVar20._8_8_;
        *(undefined8 *)*local_2188 = local_27c0;
        *(undefined8 *)(*local_2188 + 8) = uStack_27b8;
        local_27d0 = auVar19._0_8_;
        uStack_27c8 = auVar19._8_8_;
        *(undefined8 *)(*local_2188 + 0x10) = local_27d0;
        *(undefined8 *)(*local_2188 + 0x18) = uStack_27c8;
        local_27e0 = auVar4._0_8_;
        uStack_27d8 = auVar4._8_8_;
        *(undefined8 *)local_2188[1] = local_27e0;
        *(undefined8 *)(local_2188[1] + 8) = uStack_27d8;
        *(undefined1 (*) [16])(local_2188[1] + 0x10) = auVar2;
        local_2188 = local_2188 + 2;
        local_27a8 = (undefined1 (*) [16])(*local_27a8 + (long)(local_2930 << 2) * 4);
      }
    }
    if (iVar1 == 1) {
      local_2838 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_2930) * 4 + (long)(in_EDX + local_218c) * 4);
      for (local_283c = 0; local_283c < in_R9D; local_283c = local_283c + 1) {
        *(undefined1 (*) [16])*local_2188 = *local_2838;
        local_2188 = (undefined1 (*) [32])(*local_2188 + 0x10);
        local_2838 = (undefined1 (*) [16])(*local_2838 + (long)local_2930 * 4);
      }
    }
  }
  for (; local_218c + 1 < in_ECX; local_218c = local_218c + 2) {
    if (iVar1 == 8) {
      local_2848 = (undefined1 (*) [32])
                   (*in_RDI + (long)(in_R8D * local_2930) * 4 +
                   (long)((in_EDX + local_218c) * 8) * 4);
      for (local_284c = 0; local_284c + 7 < in_R9D; local_284c = local_284c + 8) {
        auVar6 = vunpcklps_avx(*local_2848,local_2848[1]);
        auVar23 = vunpckhps_avx(*local_2848,local_2848[1]);
        local_a60 = auVar6._0_8_;
        uStack_a58 = auVar6._8_8_;
        local_a80 = auVar23._0_8_;
        uStack_a78 = auVar23._8_8_;
        auVar23 = vperm2f128_avx(auVar6,auVar23,0x31);
        *(undefined8 *)*local_2188 = local_a60;
        *(undefined8 *)(*local_2188 + 8) = uStack_a58;
        *(undefined8 *)(*local_2188 + 0x10) = local_a80;
        *(undefined8 *)(*local_2188 + 0x18) = uStack_a78;
        local_2188[1] = auVar23;
        local_2188 = local_2188 + 2;
        local_2848 = (undefined1 (*) [32])(*local_2848 + (long)(local_2930 << 3) * 4);
      }
    }
    if (iVar1 == 4) {
      local_28a8 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_2930) * 4 +
                   (long)((in_EDX + local_218c) * 4) * 4);
      for (local_28ac = 0; local_28ac + 3 < in_R9D; local_28ac = local_28ac + 4) {
        auVar2 = vunpcklps_avx(*local_28a8,local_28a8[1]);
        auVar19 = vunpckhps_avx(*local_28a8,local_28a8[1]);
        local_28e0 = auVar2._0_8_;
        uStack_28d8 = auVar2._8_8_;
        *(undefined8 *)*local_2188 = local_28e0;
        *(undefined8 *)(*local_2188 + 8) = uStack_28d8;
        *(undefined1 (*) [16])(*local_2188 + 0x10) = auVar19;
        local_2188 = local_2188 + 1;
        local_28a8 = (undefined1 (*) [16])(*local_28a8 + (long)(local_2930 << 2) * 4);
      }
    }
    if (iVar1 == 1) {
      local_28f8 = (undefined4 *)
                   (*in_RDI + (long)(in_R8D * local_2930) * 4 + (long)(in_EDX + local_218c) * 4);
      for (local_28fc = 0; local_28fc < in_R9D; local_28fc = local_28fc + 1) {
        *(undefined4 *)*local_2188 = *local_28f8;
        *(undefined4 *)(*local_2188 + 4) = local_28f8[1];
        local_2188 = (undefined1 (*) [32])(*local_2188 + 8);
        local_28f8 = local_28f8 + local_2930;
      }
    }
  }
  for (; local_218c < in_ECX; local_218c = local_218c + 1) {
    if (iVar1 == 8) {
      local_2908 = (undefined1 (*) [32])
                   (*in_RDI + (long)(in_R8D * local_2930) * 4 +
                   (long)((in_EDX + local_218c) * 8) * 4);
      for (local_290c = 0; local_290c + 7 < in_R9D; local_290c = local_290c + 8) {
        *local_2188 = *local_2908;
        local_2188 = local_2188 + 1;
        local_2908 = (undefined1 (*) [32])(*local_2908 + (long)(local_2930 << 3) * 4);
      }
    }
    if (iVar1 == 4) {
      local_2918 = (undefined1 (*) [16])
                   (*in_RDI + (long)(in_R8D * local_2930) * 4 +
                   (long)((in_EDX + local_218c) * 4) * 4);
      for (local_291c = 0; local_291c + 3 < in_R9D; local_291c = local_291c + 4) {
        *(undefined1 (*) [16])*local_2188 = *local_2918;
        local_2188 = (undefined1 (*) [32])(*local_2188 + 0x10);
        local_2918 = (undefined1 (*) [16])(*local_2918 + (long)(local_2930 << 2) * 4);
      }
    }
    if (iVar1 == 1) {
      local_2928 = (undefined4 *)
                   (*in_RDI + (long)(in_R8D * local_2930) * 4 + (long)(in_EDX + local_218c) * 4);
      for (local_292c = 0; local_292c < in_R9D; local_292c = local_292c + 1) {
        *(undefined4 *)*local_2188 = *local_2928;
        local_2188 = (undefined1 (*) [32])(*local_2188 + 4);
        local_2928 = local_2928 + local_2930;
      }
    }
  }
  return;
}

Assistant:

static void transpose_pack_B_tile(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    const int elempack = B.elempack;
    const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

    float* pp = BT;

    int jj = 0;
#if __SSE2__
    for (; jj + 11 < max_jj; jj += 12)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                __m512 _r8 = _mm512_load_ps(p0 + 16 * 8);
                __m512 _r9 = _mm512_load_ps(p0 + 16 * 9);
                __m512 _ra = _mm512_load_ps(p0 + 16 * 10);
                __m512 _rb = _mm512_load_ps(p0 + 16 * 11);
                transpose16x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                pp += 192;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(p0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(p0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(p0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(p0 + 8 * 11);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                _mm256_store_ps(pp + 8 * 8, _r8);
                _mm256_store_ps(pp + 8 * 9, _r9);
                _mm256_store_ps(pp + 8 * 10, _ra);
                _mm256_store_ps(pp + 8 * 11, _rb);
                pp += 96;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(p0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(p0 + 4 * 9);
                __m128 _ra = _mm_load_ps(p0 + 4 * 10);
                __m128 _rb = _mm_load_ps(p0 + 4 * 11);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _r1);
                _mm_store_ps(pp + 4 * 4, _r5);
                _mm_store_ps(pp + 4 * 5, _r9);
                _mm_store_ps(pp + 4 * 6, _r2);
                _mm_store_ps(pp + 4 * 7, _r6);
                _mm_store_ps(pp + 4 * 8, _ra);
                _mm_store_ps(pp + 4 * 9, _r3);
                _mm_store_ps(pp + 4 * 10, _r7);
                _mm_store_ps(pp + 4 * 11, _rb);
                pp += 48;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                _mm_store_ps(pp + 4, _mm_loadu_ps(p0 + 4));
                _mm_store_ps(pp + 8, _mm_loadu_ps(p0 + 8));
                pp += 12;
                p0 += B_hstep;
            }
        }
    }
    for (; jj + 7 < max_jj; jj += 8)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                pp += 128;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                _mm_store_ps(pp + 4, _mm_loadu_ps(p0 + 4));
                pp += 8;
                p0 += B_hstep;
            }
        }
    }
    for (; jj + 3 < max_jj; jj += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                pp += 64;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                pp += 32;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r1);
                _mm_store_ps(pp + 4 * 2, _r2);
                _mm_store_ps(pp + 4 * 3, _r3);
                pp += 16;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += B_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                transpose16x2_ps(_r0, _r1);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                pp += 32;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                transpose8x2_ps(_r0, _r1);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                pp += 16;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += B_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp += 2;
                p0 += B_hstep;
            }
        }
    }
    for (; jj < max_jj; jj += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += B_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0 += B_hstep;
            }
        }
    }
}